

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

size_t ZSTD_DCtx_refDDict(ZSTD_DCtx *dctx,ZSTD_DDict *ddict)

{
  ulong uVar1;
  ZSTD_DDict **ptr;
  ZSTD_DDict *ddict_00;
  void *pvVar2;
  ZSTD_allocFunction p_Var3;
  ZSTD_freeFunction p_Var4;
  ZSTD_customMem ZVar5;
  ZSTD_DDict **ppZVar6;
  size_t sVar7;
  ZSTD_DDictHashSet *hashSet;
  size_t sVar8;
  size_t sVar9;
  
  if (dctx->streamStage != zdss_init) {
    return 0xffffffffffffffc4;
  }
  ZSTD_clearDict(dctx);
  if (ddict == (ZSTD_DDict *)0x0) {
    return 0;
  }
  dctx->ddict = ddict;
  dctx->dictUses = ZSTD_use_indefinitely;
  if (dctx->refMultipleDDicts != ZSTD_rmd_refMultipleDDicts) {
    return 0;
  }
  hashSet = dctx->ddictSet;
  if (hashSet == (ZSTD_DDictHashSet *)0x0) {
    p_Var3 = (dctx->customMem).customAlloc;
    p_Var4 = (dctx->customMem).customFree;
    pvVar2 = (dctx->customMem).opaque;
    ZVar5 = dctx->customMem;
    if (p_Var3 == (ZSTD_allocFunction)0x0) {
      hashSet = (ZSTD_DDictHashSet *)malloc(0x18);
    }
    else {
      hashSet = (ZSTD_DDictHashSet *)(*p_Var3)(pvVar2,0x18);
    }
    if (hashSet != (ZSTD_DDictHashSet *)0x0) {
      ppZVar6 = (ZSTD_DDict **)ZSTD_customCalloc(0x200,ZVar5);
      hashSet->ddictPtrTable = ppZVar6;
      if (ppZVar6 != (ZSTD_DDict **)0x0) {
        hashSet->ddictPtrTableSize = 0x40;
        hashSet->ddictPtrCount = 0;
        dctx->ddictSet = hashSet;
        goto LAB_0017511c;
      }
      if (p_Var4 == (ZSTD_freeFunction)0x0) {
        free(hashSet);
      }
      else {
        (*p_Var4)(pvVar2,hashSet);
      }
    }
    dctx->ddictSet = (ZSTD_DDictHashSet *)0x0;
    return 0xffffffffffffffc0;
  }
LAB_0017511c:
  if (dctx->staticSize != 0) {
    __assert_fail("!dctx->staticSize",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0xa231,"size_t ZSTD_DCtx_refDDict(ZSTD_DCtx *, const ZSTD_DDict *)");
  }
  ZVar5 = dctx->customMem;
  uVar1 = hashSet->ddictPtrTableSize;
  if (uVar1 <= hashSet->ddictPtrCount << 2) {
    ppZVar6 = (ZSTD_DDict **)ZSTD_customCalloc(uVar1 << 4,dctx->customMem);
    if (ppZVar6 == (ZSTD_DDict **)0x0) {
      return 0xffffffffffffffc0;
    }
    ptr = hashSet->ddictPtrTable;
    sVar8 = hashSet->ddictPtrTableSize;
    hashSet->ddictPtrTable = ppZVar6;
    hashSet->ddictPtrTableSize = uVar1 * 2;
    hashSet->ddictPtrCount = 0;
    for (sVar9 = 0; sVar8 != sVar9; sVar9 = sVar9 + 1) {
      ddict_00 = ptr[sVar9];
      if ((ddict_00 != (ZSTD_DDict *)0x0) &&
         (sVar7 = ZSTD_DDictHashSet_emplaceDDict(hashSet,ddict_00), 0xffffffffffffff88 < sVar7)) {
        return 0xffffffffffffffff;
      }
    }
    ZSTD_customFree(ptr,ZVar5);
  }
  sVar8 = ZSTD_DDictHashSet_emplaceDDict(hashSet,ddict);
  if (sVar8 < 0xffffffffffffff89) {
    return 0;
  }
  return sVar8;
}

Assistant:

size_t ZSTD_DCtx_refDDict(ZSTD_DCtx* dctx, const ZSTD_DDict* ddict)
{
    RETURN_ERROR_IF(dctx->streamStage != zdss_init, stage_wrong, "");
    ZSTD_clearDict(dctx);
    if (ddict) {
        dctx->ddict = ddict;
        dctx->dictUses = ZSTD_use_indefinitely;
        if (dctx->refMultipleDDicts == ZSTD_rmd_refMultipleDDicts) {
            if (dctx->ddictSet == NULL) {
                dctx->ddictSet = ZSTD_createDDictHashSet(dctx->customMem);
                if (!dctx->ddictSet) {
                    RETURN_ERROR(memory_allocation, "Failed to allocate memory for hash set!");
                }
            }
            assert(!dctx->staticSize);  /* Impossible: ddictSet cannot have been allocated if static dctx */
            FORWARD_IF_ERROR(ZSTD_DDictHashSet_addDDict(dctx->ddictSet, ddict, dctx->customMem), "");
        }
    }
    return 0;
}